

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialJointPolicyPureVector.cpp
# Opt level: O1

PartialJointPolicyPureVector * __thiscall
PartialJointPolicyPureVector::operator=
          (PartialJointPolicyPureVector *this,PartialJointPolicyDiscretePure *o)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar1;
  undefined4 extraout_var;
  undefined1 auVar2 [16];
  
  if (this == (PartialJointPolicyPureVector *)o) {
    return this;
  }
  auVar2 = __dynamic_cast(o,&PartialJointPolicyDiscretePure::typeinfo,&typeinfo,0);
  if (auVar2._0_8_ != 0) {
    UNRECOVERED_JUMPTABLE =
         (this->super_PartialJointPolicyDiscretePure).super_JointPolicyDiscretePure.
         super_JointPolicyDiscrete.super_JointPolicy._vptr_JointPolicy[0x17];
    iVar1 = (*UNRECOVERED_JUMPTABLE)(this,auVar2._0_8_,auVar2._8_8_,UNRECOVERED_JUMPTABLE);
    return (PartialJointPolicyPureVector *)CONCAT44(extraout_var,iVar1);
  }
  __cxa_bad_cast();
}

Assistant:

PartialJointPolicyPureVector& PartialJointPolicyPureVector::operator= (const 
        PartialJointPolicyDiscretePure& o)
{
#if DEBUG_JPOLASSIGN 
    cerr << "PartialJointPolicyPureVector& PartialJointPolicyPureVector::operator= (const PartialJointPolicyDiscretePure& o) called"<<endl;
#endif

    if (this == &o) return *this;   // Gracefully handle self assignment
    const PartialJointPolicyPureVector& p = 
        dynamic_cast<const PartialJointPolicyPureVector&>( o );
    return operator=(p);

}